

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::eval_error::eval_error
          (eval_error *this,string *t_why,File_Position *t_where,string *t_fname)

{
  string local_48;
  string *local_28;
  string *t_fname_local;
  File_Position *t_where_local;
  string *t_why_local;
  eval_error *this_local;
  
  local_28 = t_fname;
  t_fname_local = (string *)t_where;
  t_where_local = (File_Position *)t_why;
  t_why_local = (string *)this;
  format(&local_48,t_why,t_where,t_fname);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)this = &PTR__eval_error_00876908;
  std::__cxx11::string::string
            ((string *)&this->reason,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t_where_local);
  this->start_position = (File_Position)(t_fname_local->_M_dataplus)._M_p;
  std::__cxx11::string::string((string *)&this->filename,local_28);
  std::__cxx11::string::string((string *)&this->detail);
  std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::vector
            (&this->call_stack);
  return;
}

Assistant:

eval_error(const std::string &t_why, const File_Position &t_where, const std::string &t_fname) noexcept
          : std::runtime_error(format(t_why, t_where, t_fname))
          , reason(t_why)
          , start_position(t_where)
          , filename(t_fname) {
      }